

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O3

SequenceCatalogEntry *
duckdb::BindSequenceFromContext(ClientContext *context,string *catalog,string *schema,string *name)

{
  optional_ptr<duckdb::SequenceCatalogEntry,_true> entry;
  optional_ptr<duckdb::SequenceCatalogEntry,_true> local_28;
  
  Binder::BindSchemaOrCatalog(context,catalog,schema);
  local_28 = Catalog::GetEntry<duckdb::SequenceCatalogEntry>
                       (context,catalog,schema,name,THROW_EXCEPTION,
                        (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::SequenceCatalogEntry,_true>::CheckValid(&local_28);
  return local_28.ptr;
}

Assistant:

SequenceCatalogEntry &BindSequenceFromContext(ClientContext &context, string &catalog, string &schema,
                                              const string &name) {
	Binder::BindSchemaOrCatalog(context, catalog, schema);
	return Catalog::GetEntry<SequenceCatalogEntry>(context, catalog, schema, name);
}